

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<1,_460>::DiscretePhotons::verifySize(int NG)

{
  undefined8 *puVar1;
  
  if (0 < NG) {
    return;
  }
  tools::Log::error<char_const*>("Inconsistent data size");
  tools::Log::info<char_const*>("Expected NG > 0");
  tools::Log::info<char_const*,int>("NG value: {}",NG);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NG ) {

  if ( NG <= 0 ) {

    Log::error( "Inconsistent data size" );
    Log::info( "Expected NG > 0" );
    Log::info( "NG value: {}", NG );
    throw std::exception();
  }
}